

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_impl.h
# Opt level: O0

void __thiscall spdlog::logger::_sink_it(logger *this,log_msg *msg)

{
  bool bVar1;
  element_type *peVar2;
  __shared_ptr_access<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar3;
  shared_ptr<spdlog::sinks::sink> *sink;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  *__range1;
  log_msg *msg_local;
  logger *this_local;
  
  peVar2 = std::__shared_ptr_access<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->_formatter);
  (*peVar2->_vptr_formatter[2])(peVar2,msg);
  __end1 = std::
           vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
           ::begin(&this->_sinks);
  sink = (shared_ptr<spdlog::sinks::sink> *)
         std::
         vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
         ::end(&this->_sinks);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
                                     *)&sink), bVar1) {
    this_00 = (__shared_ptr_access<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
              ::operator*(&__end1);
    peVar3 = std::__shared_ptr_access<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_00);
    bVar1 = sinks::sink::should_log(peVar3,msg->level);
    if (bVar1) {
      peVar3 = std::
               __shared_ptr_access<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_00);
      (*peVar3->_vptr_sink[2])(peVar3,msg);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
    ::operator++(&__end1);
  }
  bVar1 = _should_flush_on(this,msg);
  if (bVar1) {
    (*this->_vptr_logger[2])();
  }
  return;
}

Assistant:

inline void spdlog::logger::_sink_it(details::log_msg &msg)
{
#if defined(SPDLOG_ENABLE_MESSAGE_COUNTER)
    _incr_msg_counter(msg);
#endif
    _formatter->format(msg);
    for (auto &sink : _sinks)
    {
        if (sink->should_log(msg.level))
        {
            sink->log(msg);
        }
    }

    if (_should_flush_on(msg))
    {
        flush();
    }
}